

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phi.cpp
# Opt level: O1

int64_t __thiscall anon_unknown.dwarf_467be::PhiCache::phi<_1>(PhiCache *this,int64_t x,int64_t a)

{
  uint uVar1;
  pointer piVar2;
  pointer pPVar3;
  pointer puVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int64_t iVar9;
  long lVar10;
  int64_t i_1;
  ulong a_00;
  ulong uVar11;
  ulong uVar12;
  int64_t i;
  ulong a_01;
  int64_t sum;
  ulong uVar13;
  double dVar14;
  
  piVar2 = (this->primes_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (x <= piVar2[a]) {
    return -1;
  }
  if (a < 7) {
    uVar5 = primesum::phi_tiny<long>(x,a);
  }
  else {
    if ((x < (long)(this->pi_->max_ + 1)) &&
       (lVar6 = (long)piVar2[a + 1], lVar6 = lVar6 * lVar6, lVar6 - x != 0 && x <= lVar6)) {
      pPVar3 = (this->pi_->pi_).
               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (ulong)x >> 2 & 0xfffffffffffffff0;
      return ~(POPCOUNT((ulong)(*(long *)((long)&pPVar3->bits + uVar5) << (~(byte)x & 0x3f)) >>
                        (~(byte)x & 0x3f)) + *(long *)((long)&pPVar3->prime_count + uVar5)) + a;
    }
    if (((99 < (ulong)a) ||
        (puVar4 = (this->cache_)._M_elems[a].
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start,
        (ulong)((long)(this->cache_)._M_elems[a].
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar4 >> 1) <= (ulong)x)) ||
       (puVar4[x] == 0)) {
      dVar14 = (double)x;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      uVar5 = 0xb504f333;
      if ((long)dVar14 < 0xb504f333) {
        uVar5 = (long)dVar14;
      }
      lVar6 = uVar5 * 2;
      do {
        lVar10 = uVar5 * uVar5;
        uVar5 = uVar5 - 1;
        lVar6 = lVar6 + -2;
      } while (lVar10 - x != 0 && x <= lVar10);
      do {
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 2;
      } while (lVar6 < (long)(x - uVar5 * uVar5));
      a_01 = 6;
      if ((long)uVar5 < 0xd) {
        a_01 = (ulong)*(int *)(primesum::PhiTiny::pi + uVar5 * 4);
      }
      uVar7 = a;
      if (((long)uVar5 < (long)(this->pi_->max_ + 1)) &&
         (pPVar3 = (this->pi_->pi_).
                   super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         uVar7 = uVar5 >> 2 & 0xfffffffffffffff0,
         uVar7 = POPCOUNT((ulong)(*(long *)((long)&pPVar3->bits + uVar7) << (~(byte)uVar5 & 0x3f))
                          >> (~(byte)uVar5 & 0x3f)) + *(long *)((long)&pPVar3->prime_count + uVar7),
         a <= (long)uVar7)) {
        uVar7 = a;
      }
      lVar6 = primesum::phi_tiny<long>(x,a_01);
      sum = a - (lVar6 + uVar7);
      if ((long)a_01 < (long)uVar7) {
        do {
          piVar2 = (this->primes_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (x < 0x100000000) {
            uVar5 = (x & 0xffffffffU) / (ulong)(uint)piVar2[a_01 + 1];
          }
          else {
            uVar5 = x / (long)piVar2[a_01 + 1];
          }
          lVar6 = this->pi_->max_ + 1;
          if (((long)uVar5 < lVar6) &&
             (lVar10 = (long)piVar2[a_01 + 1] * (long)piVar2[a_01 + 1],
             lVar10 - uVar5 != 0 && (long)uVar5 <= lVar10)) {
LAB_0010d229:
            pPVar3 = (this->pi_->pi_).
                     super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = uVar5 >> 2 & 0xfffffffffffffff0;
            uVar11 = (*(long *)((long)&pPVar3->prime_count + uVar11) - a_01) +
                     POPCOUNT((ulong)(*(long *)((long)&pPVar3->bits + uVar11) <<
                                     (~(byte)uVar5 & 0x3f)) >> (~(byte)uVar5 & 0x3f)) + 1;
          }
          else {
            uVar11 = 1;
            if ((long)piVar2[a_01] < (long)uVar5) {
              if ((long)a_01 < 7) {
                uVar11 = primesum::phi_tiny<long>(uVar5,a_01);
              }
              else {
                if (((long)uVar5 < lVar6) &&
                   (lVar6 = (long)piVar2[a_01 + 1] * (long)piVar2[a_01 + 1],
                   lVar6 - uVar5 != 0 && (long)uVar5 <= lVar6)) goto LAB_0010d229;
                if ((a_01 < 100) &&
                   ((puVar4 = (this->cache_)._M_elems[a_01].
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                    uVar5 < (ulong)((long)(this->cache_)._M_elems[a_01].
                                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4
                                   >> 1) && (puVar4[uVar5] != 0)))) {
                  uVar11 = (ulong)(this->cache_)._M_elems[a_01].
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5];
                }
                else {
                  dVar14 = (double)(long)uVar5;
                  if (dVar14 < 0.0) {
                    dVar14 = sqrt(dVar14);
                  }
                  else {
                    dVar14 = SQRT(dVar14);
                  }
                  uVar11 = (ulong)dVar14;
                  if (0xb504f332 < (long)uVar11) {
                    uVar11 = 0xb504f333;
                  }
                  lVar6 = uVar11 * 2;
                  uVar12 = uVar11;
                  do {
                    uVar12 = uVar12 - 1;
                    lVar6 = lVar6 + -2;
                    lVar10 = uVar11 * uVar11;
                    uVar11 = uVar11 - 1;
                  } while (lVar10 - uVar5 != 0 && (long)uVar5 <= lVar10);
                  do {
                    uVar12 = uVar12 + 1;
                    lVar6 = lVar6 + 2;
                  } while (lVar6 < (long)(uVar5 - uVar12 * uVar12));
                  a_00 = 6;
                  if ((long)uVar12 < 0xd) {
                    a_00 = (ulong)*(int *)(primesum::PhiTiny::pi + uVar12 * 4);
                  }
                  uVar13 = a_01;
                  if (((long)uVar12 < (long)(this->pi_->max_ + 1)) &&
                     (pPVar3 = (this->pi_->pi_).
                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                     uVar11 = uVar12 >> 2 & 0xfffffffffffffff0,
                     uVar13 = POPCOUNT((ulong)(*(long *)((long)&pPVar3->bits + uVar11) <<
                                              (~(byte)uVar12 & 0x3f)) >> (~(byte)uVar12 & 0x3f)) +
                              *(long *)((long)&pPVar3->prime_count + uVar11),
                     (long)a_01 < (long)uVar13)) {
                    uVar13 = a_01;
                  }
                  lVar6 = primesum::phi_tiny<long>(uVar5,a_00);
                  uVar11 = lVar6 + (uVar13 - a_01);
                  if ((long)a_00 < (long)uVar13) {
                    do {
                      piVar2 = (this->primes_->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      uVar1 = piVar2[a_00 + 1];
                      if ((long)uVar5 < 0x100000000) {
                        uVar12 = (uVar5 & 0xffffffff) / (ulong)uVar1;
                      }
                      else {
                        uVar12 = (long)uVar5 / (long)(int)uVar1;
                      }
                      if (((long)uVar12 < (long)(this->pi_->max_ + 1)) &&
                         (lVar6 = (long)piVar2[a_00 + 1], lVar6 = lVar6 * lVar6,
                         lVar6 - uVar12 != 0 && (long)uVar12 <= lVar6)) {
                        pPVar3 = (this->pi_->pi_).
                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        uVar8 = uVar12 >> 2 & 0xfffffffffffffff0;
                        iVar9 = ~(POPCOUNT((ulong)(*(long *)((long)&pPVar3->bits + uVar8) <<
                                                  (~(byte)uVar12 & 0x3f)) >> (~(byte)uVar12 & 0x3f))
                                 + *(long *)((long)&pPVar3->prime_count + uVar8)) + a_00;
                      }
                      else {
                        iVar9 = phi<_1>(this,uVar12,a_00);
                      }
                      uVar11 = uVar11 + iVar9;
                      a_00 = a_00 + 1;
                    } while (uVar13 != a_00);
                  }
                  update_cache(this,uVar5,a_01,uVar11);
                }
              }
            }
          }
          sum = sum + uVar11;
          a_01 = a_01 + 1;
        } while (a_01 != uVar7);
      }
      update_cache(this,x,a,sum);
      return sum;
    }
    uVar5 = (ulong)(this->cache_)._M_elems[a].
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start[x];
  }
  return -uVar5;
}

Assistant:

int64_t phi(int64_t x, int64_t a)
  {
    if (x <= primes_[a])
      return SIGN;
    else if (is_phi_tiny(a))
      return phi_tiny(x, a) * SIGN;
    else if (is_pix(x, a))
      return (pi_[x] - a + 1) * SIGN;
    else if (is_cached(x, a))
      return cache_[a][x] * SIGN;

    int64_t sqrtx = isqrt(x);
    int64_t pi_sqrtx = a;
    int64_t c = PhiTiny::get_c(sqrtx);
    int64_t sum = 0;

    if (sqrtx < pi_.size())
      pi_sqrtx = min(pi_[sqrtx], a);

    // Move out of the loop the calculations where phi(x2, i) = 1
    // phi(x, a) = 1 if primes_[a] >= x
    // x2 = x / primes_[i + 1]
    // phi(x2, i) = 1 if primes_[i] >= x / primes_[i + 1]
    // phi(x2, i) = 1 if primes_[i] >= sqrt(x)
    // phi(x2, i) = 1 if i >= pi(sqrt(x))
    // \sum_{i = pi(sqrt(x))}^{a - 1} phi(x2, i) = a - pi(sqrt(x))
    //
    sum += (pi_sqrtx - a) * SIGN;
    sum += phi_tiny(x, c) * SIGN;

    for (int64_t i = c; i < pi_sqrtx; i++)
    {
      int64_t x2 = fast_div(x, primes_[i + 1]);

      if (is_pix(x2, i))
        sum += (pi_[x2] - i + 1) * -SIGN;
      else
        sum += phi<-SIGN>(x2, i);
    }

    update_cache(x, a, sum);

    return sum;
  }